

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void google::protobuf::compiler::php::GenerateField
               (FieldDescriptor *field,Printer *printer,bool is_descriptor)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  FieldDescriptor *field_00;
  string local_48;
  
  if (*(int *)(field + 0x3c) == 3) {
    GenerateFieldDocComment(printer,field,(uint)is_descriptor,3);
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,"private $^name^;\n",(char (*) [5])0x3958cc,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
  }
  else {
    if (*(long *)(field + 0x58) != 0) {
      return;
    }
    GenerateFieldDocComment(printer,field,(uint)is_descriptor,3);
    args_1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field;
    DefaultForField_abi_cxx11_(&local_48,(php *)field,field_00);
    io::Printer::Print<char[5],std::__cxx11::string,char[8],std::__cxx11::string>
              (printer,"private $^name^ = ^default^;\n",(char (*) [5])0x3958cc,args_1,
               (char (*) [8])0x39c5a0,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  if (is_descriptor) {
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,"private $has_^name^ = false;\n",(char (*) [5])0x3958cc,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
  }
  return;
}

Assistant:

void GenerateField(const FieldDescriptor* field, io::Printer* printer,
                   bool is_descriptor) {
  if (field->is_repeated()) {
    GenerateFieldDocComment(printer, field, is_descriptor, kFieldProperty);
    printer->Print(
        "private $^name^;\n",
        "name", field->name());
  } else if (field->containing_oneof()) {
    // Oneof fields are handled by GenerateOneofField.
    return;
  } else {
    GenerateFieldDocComment(printer, field, is_descriptor, kFieldProperty);
    printer->Print(
        "private $^name^ = ^default^;\n",
        "name", field->name(),
        "default", DefaultForField(field));
  }

  if (is_descriptor) {
    printer->Print(
        "private $has_^name^ = false;\n",
        "name", field->name());
  }
}